

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O3

LY_ERR lyd_diff_merge_r(lyd_node *src_diff,lyd_node *diff_parent,lyd_diff_cb diff_cb,void *cb_data,
                       ly_ht **dup_inst,uint16_t options,lyd_node **diff)

{
  lysc_node *plVar1;
  ly_ctx *ctx;
  LY_ERR LVar2;
  int iVar3;
  lyd_node *plVar4;
  char *pcVar5;
  lyd_node *src_diff_00;
  lys_module *plVar6;
  ly_ht *dup_inst_ht;
  void *cb_data_00;
  lyd_node *diff_node;
  lyd_diff_op cur_op;
  lyd_diff_op src_op;
  ly_ht *child_dup_inst;
  lyd_node *local_58;
  lyd_diff_op local_50;
  lyd_diff_op local_4c;
  void *local_48;
  lyd_diff_cb local_40;
  ly_ht *local_38;
  
  local_58 = (lyd_node *)0x0;
  local_38 = (ly_ht *)0x0;
  LVar2 = lyd_diff_get_op(src_diff,&local_4c);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  local_48 = cb_data;
  local_40 = diff_cb;
  if (diff_parent == (lyd_node *)0x0) {
    plVar4 = *diff;
  }
  else {
    plVar4 = lyd_child_no_keys(diff_parent);
  }
  LVar2 = lyd_diff_find_match(plVar4,src_diff,'\x01',dup_inst,&local_58);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  if (local_58 == (lyd_node *)0x0) goto LAB_00117a3a;
  LVar2 = lyd_diff_get_op(local_58,&local_50);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  switch(local_4c) {
  case LYD_DIFF_OP_CREATE:
    if ((local_50 == LYD_DIFF_OP_CREATE) && (plVar1 = local_58->schema, plVar1 != (lysc_node *)0x0))
    {
      if (plVar1->nodetype == 8) {
        if ((plVar1->flags & 1) != 0) goto LAB_00117833;
      }
      else if ((plVar1->nodetype != 0x10) || ((plVar1->flags & 0x200) == 0)) goto LAB_00117833;
LAB_00117a3a:
      if ((diff_parent == (lyd_node *)0x0) || ((src_diff->flags & 8) == 0)) {
        LVar2 = lyd_dup_single(src_diff,(lyd_node_inner *)diff_parent,0x49,&local_58);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        if (diff_parent == (lyd_node *)0x0) {
          lyd_diff_insert_sibling(*diff,local_58,diff);
        }
      }
      else {
        if (diff_parent->schema == (lysc_node *)0x0) {
          plVar6 = (lys_module *)&diff_parent[2].schema;
        }
        else {
          plVar6 = diff_parent->schema->module;
        }
        LVar2 = lyd_dup_single_to_ctx
                          (src_diff,plVar6->ctx,(lyd_node_inner *)diff_parent,0x49,&local_58);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
      }
      LVar2 = lyd_diff_change_op(local_58,local_4c);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      plVar4 = local_58;
      if ((local_40 != (lyd_diff_cb)0x0) &&
         (LVar2 = (*local_40)((lyd_node *)0x0,local_58,local_48), plVar4 = local_58,
         LVar2 != LY_SUCCESS)) {
        return LVar2;
      }
      goto LAB_00117aec;
    }
LAB_00117833:
    LVar2 = lyd_diff_merge_create(&local_58,diff,local_50,src_diff,options);
    break;
  case LYD_DIFF_OP_DELETE:
    LVar2 = lyd_diff_merge_delete(local_58,local_50,src_diff);
    break;
  case LYD_DIFF_OP_REPLACE:
    LVar2 = lyd_diff_merge_replace(local_58,local_50,src_diff);
    break;
  case LYD_DIFF_OP_NONE:
    if ((src_diff->schema->nodetype == 0x10) && ((src_diff->schema->flags & 0x200) != 0)) {
      __assert_fail("(src_diff->schema->nodetype != LYS_LIST) || !lysc_is_dup_inst_list(src_diff->schema)"
                    ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                    ,0x7cb,
                    "LY_ERR lyd_diff_merge_r(const struct lyd_node *, struct lyd_node *, lyd_diff_cb, void *, struct ly_ht **, uint16_t, struct lyd_node **)"
                   );
    }
    LVar2 = lyd_diff_merge_none(local_58,local_50,src_diff);
    break;
  default:
    if (src_diff->schema == (lysc_node *)0x0) {
      plVar6 = (lys_module *)&src_diff[2].schema;
    }
    else {
      plVar6 = src_diff->schema->module;
    }
    ly_log(plVar6->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",1999);
    return LY_EINT;
  }
  if (LVar2 != LY_SUCCESS) {
    if (src_diff->schema == (lysc_node *)0x0) {
      plVar6 = (lys_module *)&src_diff[2].schema;
    }
    else {
      plVar6 = src_diff->schema->module;
    }
    ctx = plVar6->ctx;
    pcVar5 = lyd_diff_op2str(local_4c);
    ly_log(ctx,LY_LLERR,LY_EOTHER,"Merging operation \"%s\" failed.",pcVar5);
    return LVar2;
  }
  if ((local_40 != (lyd_diff_cb)0x0) &&
     (LVar2 = (*local_40)(src_diff,local_58,local_48), LVar2 != LY_SUCCESS)) {
    return LVar2;
  }
  cb_data_00 = local_48;
  plVar4 = local_58;
  plVar1 = src_diff->schema;
  if (plVar1 != (lysc_node *)0x0) {
    if (plVar1->nodetype == 8) {
      if ((plVar1->flags & 1) == 0) goto LAB_00117aec;
    }
    else if ((plVar1->nodetype == 0x10) && ((plVar1->flags & 0x200) != 0)) goto LAB_00117aec;
  }
  src_diff_00 = lyd_child_no_keys(src_diff);
  if (src_diff_00 == (lyd_node *)0x0) {
    dup_inst_ht = (ly_ht *)0x0;
  }
  else {
    do {
      LVar2 = lyd_diff_merge_r(src_diff_00,plVar4,local_40,cb_data_00,&local_38,options,diff);
      if (LVar2 != LY_SUCCESS) {
        lyd_dup_inst_free(local_38);
        return LVar2;
      }
      src_diff_00 = src_diff_00->next;
      dup_inst_ht = local_38;
      cb_data_00 = local_48;
    } while (src_diff_00 != (lyd_node *)0x0);
  }
  lyd_dup_inst_free(dup_inst_ht);
LAB_00117aec:
  iVar3 = lyd_diff_is_redundant(plVar4);
  if (iVar3 != 0) {
    if (plVar4 == *diff) {
      *diff = (*diff)->next;
    }
    lyd_free_tree(plVar4);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyd_diff_merge_r(const struct lyd_node *src_diff, struct lyd_node *diff_parent, lyd_diff_cb diff_cb, void *cb_data,
        struct ly_ht **dup_inst, uint16_t options, struct lyd_node **diff)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_node *child, *diff_node = NULL;
    enum lyd_diff_op src_op, cur_op;
    struct ly_ht *child_dup_inst = NULL;

    /* get source node operation */
    LY_CHECK_RET(lyd_diff_get_op(src_diff, &src_op));

    /* find an equal node in the current diff */
    LY_CHECK_RET(lyd_diff_find_match(diff_parent ? lyd_child_no_keys(diff_parent) : *diff, src_diff, 1, dup_inst, &diff_node));

    if (diff_node) {
        /* get target (current) operation */
        LY_CHECK_RET(lyd_diff_get_op(diff_node, &cur_op));

        /* merge operations */
        switch (src_op) {
        case LYD_DIFF_OP_REPLACE:
            ret = lyd_diff_merge_replace(diff_node, cur_op, src_diff);
            break;
        case LYD_DIFF_OP_CREATE:
            if ((cur_op == LYD_DIFF_OP_CREATE) && lysc_is_dup_inst_list(diff_node->schema)) {
                /* special case of creating duplicate (leaf-)list instances */
                goto add_diff;
            }

            ret = lyd_diff_merge_create(&diff_node, diff, cur_op, src_diff, options);
            break;
        case LYD_DIFF_OP_DELETE:
            ret = lyd_diff_merge_delete(diff_node, cur_op, src_diff);
            break;
        case LYD_DIFF_OP_NONE:
            /* key-less list can never have "none" operation since all its descendants are acting as "keys" */
            assert((src_diff->schema->nodetype != LYS_LIST) || !lysc_is_dup_inst_list(src_diff->schema));
            ret = lyd_diff_merge_none(diff_node, cur_op, src_diff);
            break;
        default:
            LOGINT_RET(LYD_CTX(src_diff));
        }
        if (ret) {
            LOGERR(LYD_CTX(src_diff), LY_EOTHER, "Merging operation \"%s\" failed.", lyd_diff_op2str(src_op));
            return ret;
        }

        if (diff_cb) {
            /* call callback */
            LY_CHECK_RET(diff_cb(src_diff, diff_node, cb_data));
        }

        /* update diff parent */
        diff_parent = diff_node;

        /* for diff purposes, all key-less list descendants actually act as keys (identifying the same instances),
         * so there is nothing to merge for these "keys" */
        if (!lysc_is_dup_inst_list(src_diff->schema)) {
            /* merge src_diff recursively */
            LY_LIST_FOR(lyd_child_no_keys(src_diff), child) {
                ret = lyd_diff_merge_r(child, diff_parent, diff_cb, cb_data, &child_dup_inst, options, diff);
                if (ret) {
                    break;
                }
            }
            lyd_dup_inst_free(child_dup_inst);
            LY_CHECK_RET(ret);
        }
    } else {
add_diff:
        /* add new diff node with all descendants */
        if ((src_diff->flags & LYD_EXT) && diff_parent) {
            LY_CHECK_RET(lyd_dup_single_to_ctx(src_diff, LYD_CTX(diff_parent), (struct lyd_node_inner *)diff_parent,
                    LYD_DUP_RECURSIVE | LYD_DUP_WITH_FLAGS | LYD_DUP_NO_LYDS, &diff_node));
        } else {
            LY_CHECK_RET(lyd_dup_single(src_diff, (struct lyd_node_inner *)diff_parent,
                    LYD_DUP_RECURSIVE | LYD_DUP_WITH_FLAGS | LYD_DUP_NO_LYDS, &diff_node));
        }

        /* insert node into diff if not already */
        if (!diff_parent) {
            lyd_diff_insert_sibling(*diff, diff_node, diff);
        }

        /* update operation */
        LY_CHECK_RET(lyd_diff_change_op(diff_node, src_op));

        if (diff_cb) {
            /* call callback with no source diff node since it was duplicated and just added */
            LY_CHECK_RET(diff_cb(NULL, diff_node, cb_data));
        }

        /* update diff parent */
        diff_parent = diff_node;
    }

    /* remove any redundant nodes */
    if (lyd_diff_is_redundant(diff_parent)) {
        if (diff_parent == *diff) {
            *diff = (*diff)->next;
        }
        lyd_free_tree(diff_parent);
    }

    return LY_SUCCESS;
}